

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::SetStopTimePassed(cmCTestMultiProcessHandler *this)

{
  cmCTest *this_00;
  ostream *this_01;
  char *msg;
  string local_1b8 [48];
  ostringstream local_188 [8];
  ostringstream cmCTestLog_msg;
  cmCTestMultiProcessHandler *this_local;
  
  if ((this->StopTimePassed & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    this_01 = std::operator<<((ostream *)local_188,
                              "The stop time has been passed. Stopping all tests.");
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    this_00 = this->CTest;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x18a,msg,false);
    std::__cxx11::string::~string(local_1b8);
    std::__cxx11::ostringstream::~ostringstream(local_188);
    this->StopTimePassed = true;
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::SetStopTimePassed()
{
  if (!this->StopTimePassed) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "The stop time has been passed. "
               "Stopping all tests."
                 << std::endl);
    this->StopTimePassed = true;
  }
}